

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile(TiledRgbaInputFile *this)

{
  TiledInputFile *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  FromYa *pFVar3;
  Rgba *pRVar4;
  pointer pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  this->_vptr_TiledRgbaInputFile = (_func_int **)&PTR__TiledRgbaInputFile_001e44e0;
  pTVar1 = this->_inputFile;
  if (pTVar1 != (TiledInputFile *)0x0) {
    p_Var2 = (pTVar1->_data).
             super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    p_Var2 = (pTVar1->_ctxt)._ctxt.
             super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  operator_delete(pTVar1,0x20);
  pFVar3 = this->_fromYa;
  if ((pFVar3 != (FromYa *)0x0) && (pRVar4 = (pFVar3->_buf)._data, pRVar4 != (Rgba *)0x0)) {
    operator_delete__(pRVar4);
  }
  operator_delete(pFVar3,0x78);
  pcVar5 = (this->_channelNamePrefix)._M_dataplus._M_p;
  paVar6 = &(this->_channelNamePrefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar6) {
    operator_delete(pcVar5,paVar6->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

TiledRgbaInputFile::~TiledRgbaInputFile ()
{
    delete _inputFile;
    delete _fromYa;
}